

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

const_iterator __thiscall
burst::k_ary_search_set<long,_std::less<void>_>::find_impl
          (k_ary_search_set<long,_std::less<void>_> *this,value_type_conflict2 *value)

{
  pointer plVar1;
  long *plVar2;
  long lVar3;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    plVar1 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar2 = (this->m_values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)plVar2 - (long)plVar1 >> 3) <= uVar6) {
      return (const_iterator)plVar2;
    }
    plVar1 = plVar1 + uVar6;
    lVar5 = this->m_arity - 1;
    lVar3 = (long)plVar2 - (long)plVar1 >> 3;
    if (lVar5 <= lVar3) {
      lVar3 = lVar5;
    }
    _Var4 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_comp_val<std::less<void>>>
                      (plVar1,plVar1 + lVar3,value);
    if ((_Var4._M_current != plVar1 + lVar3) && (*_Var4._M_current <= *value)) break;
    uVar6 = uVar6 * this->m_arity +
            (this->m_arity - 1) * (((long)_Var4._M_current - (long)plVar1 >> 3) + 1);
  }
  return (const_iterator)_Var4._M_current;
}

Assistant:

const_iterator find_impl (const value_type & value) const
        {
            std::size_t node_index = 0;

            while (node_index < m_values.size())
            {
                const_iterator node_begin = begin() + static_cast<difference_type>(node_index);
                const_iterator node_end =
                    node_begin +
                    std::min
                    (
                        static_cast<difference_type>(m_arity - 1),
                        std::distance(node_begin, end())
                    );

                const_iterator search_result =
                    std::lower_bound(node_begin, node_end, value, m_compare);
                if (search_result != node_end && not m_compare(value, *search_result))
                {
                    return search_result;
                }
                else
                {
                    node_index = perfect_tree_child_index
                    (
                        m_arity,
                        node_index,
                        static_cast<std::size_t>(std::distance(node_begin, search_result))
                    );
                }
            }

            return end();
        }